

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Customer.cpp
# Opt level: O2

string * __thiscall Customer::getAdress_abi_cxx11_(string *__return_storage_ptr__,Customer *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->adress);
  return __return_storage_ptr__;
}

Assistant:

string Customer::getAdress() const{
	return adress;
}